

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O2

void * kmpc_aligned_malloc(size_t size,size_t alignment)

{
  kmp_info_t *th;
  void *pvVar1;
  int *piVar2;
  void *pvVar3;
  
  if ((alignment & alignment - 1) == 0) {
    th = __kmp_entry_thread();
    pvVar1 = bget(th,alignment + size + 8);
    if (pvVar1 != (void *)0x0) {
      pvVar3 = (void *)(-alignment & alignment + 8 + (long)pvVar1);
      *(void **)((long)pvVar3 + -8) = pvVar1;
      return pvVar3;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (void *)0x0;
}

Assistant:

void *
kmpc_aligned_malloc( size_t size, size_t alignment )
{
    void * ptr;
    void * ptr_allocated;
    KMP_DEBUG_ASSERT( alignment < 32 * 1024 ); // Alignment should not be too big
    if( !IS_POWER_OF_TWO(alignment) ) {
        // AC: do we need to issue a warning here?
        errno = EINVAL;
        return NULL;
    }
    size = size + sizeof( void* ) + alignment;
    ptr_allocated = bget( __kmp_entry_thread(), (bufsize)size );
    if( ptr_allocated != NULL ) {
        // save allocated pointer just before one returned to user
        ptr = (void*)(((kmp_uintptr_t)ptr_allocated + sizeof( void* ) + alignment) & ~(alignment - 1));
        *((void**)ptr - 1) = ptr_allocated;
    } else {
        ptr = NULL;
    }
    return ptr;
}